

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O1

void __thiscall
bidirectional::BiDirectional::updateCurrentLabel(BiDirectional *this,Directions *direction)

{
  _Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_> this_00;
  _Tuple_impl<0UL,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_*,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
  _Var1;
  Label local_90;
  
  this_00.super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl =
       (&this->fwd_search_ptr_)[*direction != FWD]._M_t.
       super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>.
       _M_t.
       super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>.
       super__Head_base<0UL,_bidirectional::Search_*,_false>;
  _Var1.
  super__Head_base<0UL,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_*,_false>.
  _M_head_impl = (((unique_ptr<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
                    *)((long)this_00.super__Head_base<0UL,_bidirectional::Search_*,_false>.
                             _M_head_impl + 0xa0))->_M_t).
                 super___uniq_ptr_impl<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_*,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_*,_false>
  ;
  if (*(long *)((long)_Var1.
                      super__Head_base<0UL,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_*,_false>
                      ._M_head_impl + 8) ==
      *(long *)_Var1.
               super__Head_base<0UL,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_*,_false>
               ._M_head_impl) {
    *(bool *)((long)this_00.super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl + 4)
         = true;
  }
  else {
    labelling::getNextLabel
              (&local_90,
               (vector<labelling::Label,_std::allocator<labelling::Label>_> *)
               _Var1.
               super__Head_base<0UL,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_*,_false>
               ._M_head_impl,direction);
    Search::replaceCurrentLabel
              ((Search *)this_00.super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl,
               &local_90);
    _Var1.
    super__Head_base<0UL,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_*,_false>
    ._M_head_impl =
         (((unique_ptr<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
            *)((long)this_00.super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl +
              0xa0))->_M_t).
         super___uniq_ptr_impl<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_*,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
         .
         super__Head_base<0UL,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_*,_false>
    ;
    *(int *)((long)this_00.super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl + 8) =
         (int)((ulong)(*(long *)((long)_Var1.
                                       super__Head_base<0UL,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_*,_false>
                                       ._M_head_impl + 8) -
                      *(long *)_Var1.
                               super__Head_base<0UL,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_*,_false>
                               ._M_head_impl) >> 7);
    labelling::Label::~Label(&local_90);
  }
  return;
}

Assistant:

void BiDirectional::updateCurrentLabel(const Directions& direction) {
  Search* search_ptr = getSearchPtr(direction);
  if (search_ptr->unprocessed_labels->size() > 0) {
    // Get next label and removes current_label from heap
    const labelling::Label& new_label = labelling::getNextLabel(
        search_ptr->unprocessed_labels.get(), direction);
    // swap current label with new label
    search_ptr->replaceCurrentLabel(new_label);
    // Update unprocessed label counter
    search_ptr->unprocessed_count = search_ptr->unprocessed_labels->size();
    SPDLOG_DEBUG("{} left in {}", search_ptr->unprocessed_count, direction);
  } else {
    search_ptr->stop = true;
  }
}